

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

void get_range<double,long>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,long *Xc_ind,
               long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  long lVar1;
  ulong *puVar2;
  ulong *puVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  lVar9 = Xc_indptr[col_num];
  lVar5 = Xc_indptr[col_num + 1];
  bVar10 = true;
  if (lVar5 == lVar9) goto LAB_001e5e3d;
  uVar12 = Xc_ind[lVar9];
  if ((long)ix_arr[end] < (long)uVar12) goto LAB_001e5e3d;
  lVar1 = lVar5 + -1;
  uVar6 = Xc_ind[lVar1];
  if ((long)uVar6 < (long)ix_arr[st]) goto LAB_001e5e3d;
  puVar3 = ix_arr + end;
  puVar14 = ix_arr + st;
  uVar11 = (end - st) + 1;
  if (((long)ix_arr[st] < (long)uVar12 || (ulong)(lVar5 - lVar9) < uVar11) ||
      (long)uVar6 < (long)ix_arr[end]) {
    *xmin = 0.0;
    *xmax = 0.0;
    dVar21 = 0.0;
    dVar19 = 0.0;
  }
  else {
    dVar19 = -INFINITY;
    dVar21 = INFINITY;
  }
  puVar2 = puVar3 + 1;
  uVar13 = (long)puVar2 - (long)puVar14 >> 3;
  if (missing_action == Fail) {
    while (0 < (long)uVar13) {
      uVar15 = uVar13 >> 1;
      uVar18 = ~uVar15 + uVar13;
      uVar13 = uVar15;
      if (puVar14[uVar15] < uVar12) {
        puVar14 = puVar14 + uVar15 + 1;
        uVar13 = uVar18;
      }
    }
    if (puVar14 == puVar2) goto LAB_001e5dd2;
    lVar8 = lVar1 * 8 + 8;
    uVar12 = 0;
    while (uVar13 = *puVar14, uVar13 <= uVar6) {
      puVar17 = (ulong *)(Xc_ind + lVar9);
      uVar15 = *puVar17;
      if (uVar15 == uVar13) {
        uVar12 = uVar12 + 1;
        dVar4 = Xc[lVar9];
        dVar20 = dVar4;
        if (dVar21 <= dVar4) {
          dVar20 = dVar21;
        }
        *xmin = dVar20;
        if (dVar4 <= dVar19) {
          dVar4 = dVar19;
        }
        dVar19 = dVar4;
        *xmax = dVar19;
        dVar21 = dVar20;
        if ((puVar14 == puVar3) || (lVar9 == lVar1)) break;
        puVar14 = puVar14 + 1;
        uVar13 = (long)Xc_ind + (lVar8 - (long)puVar17) >> 3;
        if (0 < (long)uVar13) {
          do {
            uVar15 = uVar13 >> 1;
            uVar18 = ~uVar15 + uVar13;
            uVar13 = uVar15;
            if (puVar17[uVar15] < *puVar14) {
              puVar17 = puVar17 + uVar15 + 1;
              uVar13 = uVar18;
            }
          } while (0 < (long)uVar13);
        }
        lVar9 = (long)puVar17 - (long)Xc_ind >> 3;
      }
      else if ((long)uVar13 < (long)uVar15) {
        puVar14 = puVar14 + 1;
        uVar13 = (long)puVar2 - (long)puVar14 >> 3;
        while (0 < (long)uVar13) {
          uVar18 = uVar13 >> 1;
          uVar16 = ~uVar18 + uVar13;
          uVar13 = uVar18;
          if (puVar14[uVar18] < uVar15) {
            puVar14 = puVar14 + uVar18 + 1;
            uVar13 = uVar16;
          }
        }
      }
      else {
        puVar7 = puVar17 + 1;
        uVar15 = (long)Xc_ind + (lVar8 - (long)(puVar17 + 1)) >> 3;
        while (0 < (long)uVar15) {
          uVar18 = uVar15 >> 1;
          uVar16 = ~uVar18 + uVar15;
          uVar15 = uVar18;
          if (puVar7[uVar18] < uVar13) {
            puVar7 = puVar7 + uVar18 + 1;
            uVar15 = uVar16;
          }
        }
        lVar9 = (long)puVar7 - (long)Xc_ind >> 3;
      }
      if ((puVar14 == puVar2) || (lVar9 == lVar5)) break;
    }
  }
  else {
    while (0 < (long)uVar13) {
      uVar15 = uVar13 >> 1;
      uVar18 = ~uVar15 + uVar13;
      uVar13 = uVar15;
      if (puVar14[uVar15] < uVar12) {
        puVar14 = puVar14 + uVar15 + 1;
        uVar13 = uVar18;
      }
    }
    if (puVar14 == puVar2) {
LAB_001e5dd2:
      uVar12 = 0;
    }
    else {
      lVar8 = lVar1 * 8 + 8;
      uVar12 = 0;
      while (uVar13 = *puVar14, uVar13 <= uVar6) {
        puVar17 = (ulong *)(Xc_ind + lVar9);
        uVar15 = *puVar17;
        if (uVar15 == uVar13) {
          uVar12 = uVar12 + 1;
          dVar4 = Xc[lVar9];
          dVar20 = dVar4;
          if (dVar21 <= dVar4) {
            dVar20 = dVar21;
          }
          dVar21 = (double)(~-(ulong)NAN(dVar21) & (ulong)dVar20 |
                           -(ulong)NAN(dVar21) & (ulong)dVar4);
          *xmin = dVar21;
          dVar20 = dVar4;
          if (dVar4 <= dVar19) {
            dVar20 = dVar19;
          }
          dVar19 = (double)(~-(ulong)NAN(dVar19) & (ulong)dVar20 |
                           -(ulong)NAN(dVar19) & (ulong)dVar4);
          *xmax = dVar19;
          if ((puVar14 == puVar3) || (lVar9 == lVar1)) break;
          puVar14 = puVar14 + 1;
          uVar13 = (long)Xc_ind + (lVar8 - (long)puVar17) >> 3;
          if (0 < (long)uVar13) {
            do {
              uVar15 = uVar13 >> 1;
              uVar18 = ~uVar15 + uVar13;
              uVar13 = uVar15;
              if (puVar17[uVar15] < *puVar14) {
                puVar17 = puVar17 + uVar15 + 1;
                uVar13 = uVar18;
              }
            } while (0 < (long)uVar13);
          }
          lVar9 = (long)puVar17 - (long)Xc_ind >> 3;
        }
        else if ((long)uVar13 < (long)uVar15) {
          puVar14 = puVar14 + 1;
          uVar13 = (long)puVar2 - (long)puVar14 >> 3;
          while (0 < (long)uVar13) {
            uVar18 = uVar13 >> 1;
            uVar16 = ~uVar18 + uVar13;
            uVar13 = uVar18;
            if (puVar14[uVar18] < uVar15) {
              puVar14 = puVar14 + uVar18 + 1;
              uVar13 = uVar16;
            }
          }
        }
        else {
          puVar7 = puVar17 + 1;
          uVar15 = (long)Xc_ind + (lVar8 - (long)(puVar17 + 1)) >> 3;
          while (0 < (long)uVar15) {
            uVar18 = uVar15 >> 1;
            uVar16 = ~uVar18 + uVar15;
            uVar15 = uVar18;
            if (puVar7[uVar18] < uVar13) {
              puVar7 = puVar7 + uVar18 + 1;
              uVar15 = uVar16;
            }
          }
          lVar9 = (long)puVar7 - (long)Xc_ind >> 3;
        }
        if ((puVar14 == puVar2) || (lVar9 == lVar5)) break;
      }
    }
  }
  if (uVar12 < uVar11) {
    if (0.0 <= dVar21) {
      dVar21 = 0.0;
    }
    *xmin = dVar21;
    if (dVar19 <= 0.0) {
      dVar19 = 0.0;
    }
    *xmax = dVar19;
  }
  if (((dVar21 != dVar19) || (NAN(dVar21) || NAN(dVar19))) &&
     (dVar19 != -INFINITY || dVar21 != INFINITY)) {
    bVar10 = NAN(dVar19);
  }
LAB_001e5e3d:
  *unsplittable = bVar10;
  return;
}

Assistant:

void get_range(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    /* ix_arr must already be sorted beforehand */
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1];
    size_t nnz_col = end_col - st_col;
    end_col--;
    size_t curr_pos = st_col;

    if (!nnz_col || 
        Xc_ind[st_col]         >   (sparse_ix)ix_arr[end] || 
        (sparse_ix)ix_arr[st]  >   Xc_ind[end_col]
        )
    {
        unsplittable = true;
        return;
    }

    if (nnz_col < end - st + 1 ||
        Xc_ind[st_col]  > (sparse_ix)ix_arr[st] ||
        Xc_ind[end_col] < (sparse_ix)ix_arr[end]
        )
    {
        xmin = 0;
        xmax = 0;
    }

    size_t ind_end_col = Xc_ind[end_col];
    size_t nmatches = 0;

    if (missing_action == Fail)
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = (Xc[curr_pos] < xmin)? Xc[curr_pos] : xmin;
                xmax = (Xc[curr_pos] > xmax)? Xc[curr_pos] : xmax;
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }
    }

    else /* can have NAs */
    {
        for (size_t *row = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);
             row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
            )
        {
            if (Xc_ind[curr_pos] == (sparse_ix)(*row))
            {
                nmatches++;
                xmin = std::fmin(xmin, Xc[curr_pos]);
                xmax = std::fmax(xmax, Xc[curr_pos]);
                if (row == ix_arr + end || curr_pos == end_col) break;
                curr_pos = std::lower_bound(Xc_ind + curr_pos, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
            }

            else
            {
                if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                    row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
                else
                    curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
            }
        }

    }

    if (nmatches < (end - st + 1))
    {
        xmin = std::fmin(xmin, 0);
        xmax = std::fmax(xmax, 0);
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}